

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DisableForkStatementSyntax *pDVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_retaddr;
  NamedLabelSyntax **in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  NamedLabelSyntax *in_stack_ffffffffffffffa0;
  NamedLabelSyntax *local_58;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_58 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_58 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DisableForkStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (Token *)__child_stack,(Token *)local_58);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DisableForkStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DisableForkStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.disable.deepClone(alloc),
        node.fork.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}